

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdgeTopology.hpp
# Opt level: O3

EdgeTopology *
eos::morphablemodel::load_edge_topology(EdgeTopology *__return_storage_ptr__,string *filename)

{
  size_t *psVar1;
  JSONInputArchive *pJVar2;
  pointer pIVar3;
  runtime_error *this;
  JSONInputArchive output_archive;
  ifstream file;
  NameValuePair<std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_&>
  local_418;
  NameValuePair<std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_&>
  local_408;
  JSONInputArchive local_3f8;
  long local_228 [4];
  byte abStack_208 [488];
  
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    cereal::JSONInputArchive::JSONInputArchive(&local_3f8,(istream *)local_228);
    pJVar2 = ((local_3f8.super_InputArchive<cereal::JSONInputArchive,_0U>.self)->
             super_InputArchive<cereal::JSONInputArchive,_0U>).self;
    pJVar2->itsNextName = "edge_topology";
    cereal::JSONInputArchive::startNode
              ((pJVar2->super_InputArchive<cereal::JSONInputArchive,_0U>).self);
    local_408.name = "adjacent_faces";
    local_418.value = &__return_storage_ptr__->adjacent_vertices;
    local_418.name = "adjacent_vertices";
    local_408.value = &__return_storage_ptr__->adjacent_faces;
    cereal::InputArchive<cereal::JSONInputArchive,0u>::
    process<cereal::NameValuePair<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>&>,cereal::NameValuePair<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>&>>
              ((InputArchive<cereal::JSONInputArchive,0u> *)
               (((pJVar2->super_InputArchive<cereal::JSONInputArchive,_0U>).self)->
               super_InputArchive<cereal::JSONInputArchive,_0U>).self,&local_408,&local_418);
    pJVar2 = (pJVar2->super_InputArchive<cereal::JSONInputArchive,_0U>).self;
    pIVar3 = (pJVar2->itsIteratorStack).
             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (pJVar2->itsIteratorStack).
    super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar3 + -1;
    psVar1 = &pIVar3[-2].itsIndex;
    *psVar1 = *psVar1 + 1;
    cereal::JSONInputArchive::~JSONInputArchive(&local_3f8);
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f8,
                 "Error opening file for reading: ",filename);
  std::runtime_error::runtime_error(this,(string *)&local_3f8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline EdgeTopology load_edge_topology(std::string filename)
{
    EdgeTopology edge_topology;
    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error("Error opening file for reading: " + filename);
    }
    cereal::JSONInputArchive output_archive(file);
    output_archive(cereal::make_nvp("edge_topology", edge_topology));

    return edge_topology;
}